

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::PromoteObjectSynchData
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,VOID *pvLocalSynchData,
          VOID **ppvSharedSynchData)

{
  CSHRWaitingThreadsListNodeCache *this_00;
  CWaitingThreadsListNodeCache *this_01;
  uint n;
  CObjectType *pCVar1;
  long *plVar2;
  MonitoredProcessesListNode *pMVar3;
  _WaitingThreadsListNode *p_Var4;
  OwnedObjectsListNode *pOVar5;
  CPalSynchronizationManager *pCVar6;
  SHMPTR *pSVar7;
  CSynchData *pCVar8;
  uint uVar9;
  LONG lSignalCount;
  ulong *puVar10;
  LPVOID pvVar11;
  int iVar12;
  _WaitingThreadsListNode *pobj;
  PAL_ERROR PVar13;
  ulong uVar14;
  undefined4 uVar15;
  int iVar16;
  long lVar17;
  SHMPTR local_80;
  SHMPTR shridObj;
  CObjectType *local_70;
  CPalThread *local_68;
  CSynchData *local_60;
  SHMPTR local_58;
  CPalSynchronizationManager *local_50;
  SHMPTR *local_48;
  ulong local_40;
  CSynchData *local_38;
  
  if (pthrCurrent == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7c);
    fprintf(_stderr,"Expression: NULL != pthrCurrent\n");
  }
  if (pvLocalSynchData == (VOID *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7d);
    fprintf(_stderr,"Expression: NULL != pvLocalSynchData\n");
  }
  if (ppvSharedSynchData == (VOID **)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7e);
    fprintf(_stderr,"Expression: NULL != ppvSharedSynchData\n");
  }
  if (*(int *)((long)pvLocalSynchData + 0x20) != 0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7f);
    fprintf(_stderr,"Expression: ProcessLocalObject == psdLocal->GetObjectDomain()\n");
  }
  local_80 = 0;
  CSHRSynchCache<CorUnix::CSynchData>::Get(&this->m_cacheSHRSynchData,pthrCurrent,1,&local_80);
  if (local_80 == 0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      return 8;
    }
    abort();
  }
  local_58 = local_80;
  shridObj = (SHMPTR)ppvSharedSynchData;
  local_50 = this;
  local_38 = (CSynchData *)SHMPtrToPtr(local_80);
  if (local_38 == (CSynchData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd95);
    fprintf(_stderr,"Expression: NULL != psdShared\n");
  }
  n = *(uint *)((long)pvLocalSynchData + 0x10);
  uVar14 = (ulong)n;
  local_40 = uVar14;
  if (uVar14 == 0) {
    local_48 = (SHMPTR *)0x0;
LAB_003479a2:
    pCVar1 = CObjectType::s_rgotIdMapping[*(uint *)((long)pvLocalSynchData + 0x24)];
    if (pCVar1 == (CObjectType *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0xdc0);
      fprintf(_stderr,"Expression: NULL != pot\n");
    }
    local_70 = pCVar1;
    if (pCVar1->m_eTypeId == otiProcess) {
      InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
    }
    pCVar8 = local_38;
    local_38->m_shridThis = local_58;
    local_38->m_odObjectDomain = SharedObject;
    local_38->m_otiObjectTypeId =
         CObjectType::s_rgotIdMapping[*(uint *)((long)pvLocalSynchData + 0x24)]->m_eTypeId;
    lSignalCount = CSynchData::GetSignalCount((CSynchData *)pvLocalSynchData);
    CSynchData::SetSignalCount(pCVar8,lSignalCount);
    (pCVar8->m_ptrWTLHead).shrid = 0;
    (pCVar8->m_ptrWTLTail).shrid = 0;
    uVar14 = local_40;
    if (local_40 != 0) {
      lVar17 = *pvLocalSynchData;
      local_68 = pthrCurrent;
      local_60 = (CSynchData *)pvLocalSynchData;
      if (lVar17 != 0) {
        iVar16 = 0;
        do {
          pSVar7 = local_48;
          pvVar11 = SHMPtrToPtr(local_48[iVar16]);
          if (pvVar11 == (LPVOID)0x0) {
            fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                    ,0xded);
            fprintf(_stderr,"Expression: NULL != pwtlnNew\n");
          }
          pCVar8 = local_38;
          *(SHMPTR *)((long)pvVar11 + 0x10) = pSVar7[iVar16];
          *(SHMPTR *)((long)pvVar11 + 0x30) = local_58;
          *(undefined8 *)((long)pvVar11 + 0x18) = *(undefined8 *)(lVar17 + 0x18);
          *(undefined4 *)((long)pvVar11 + 0x20) = *(undefined4 *)(lVar17 + 0x20);
          *(uint *)((long)pvVar11 + 0x24) = *(uint *)(lVar17 + 0x24) | 1;
          *(undefined8 *)((long)pvVar11 + 0x28) = *(undefined8 *)(lVar17 + 0x28);
          *(undefined8 *)((long)pvVar11 + 0x38) = *(undefined8 *)(lVar17 + 0x38);
          CSynchData::SharedWaiterEnqueue(local_38,pSVar7[iVar16]);
          LOCK();
          pCVar8->m_lRefCount = pCVar8->m_lRefCount + 1;
          UNLOCK();
          plVar2 = *(long **)(*(long *)(lVar17 + 0x38) + 0x18 + (ulong)*(uint *)(lVar17 + 0x20) * 8)
          ;
          if (plVar2 == (long *)0x0) {
            fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                    ,0xdfc);
            fprintf(_stderr,
                    "Expression: pwtlnOld = pwtlnOld->ptwiWaitInfo->rgpWTLNodes[pwtlnOld->dwObjIndex]\n"
                   );
          }
          *(LPVOID *)
           (*(long *)((long)pvVar11 + 0x38) + 0x18 + (ulong)*(uint *)((long)pvVar11 + 0x20) * 8) =
               pvVar11;
          lVar17 = *(long *)((long)pvVar11 + 0x38);
          iVar12 = *(int *)(lVar17 + 0xc) + 1;
          *(int *)(lVar17 + 0xc) = iVar12;
          uVar15 = 2;
          if ((iVar12 != *(int *)(lVar17 + 8)) && (uVar15 = 1, *(int *)(lVar17 + 8) <= iVar12)) {
            fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                    ,0xe08);
            fprintf(_stderr,
                    "Expression: pwtlnNew->ptwiWaitInfo->lSharedObjCount < pwtlnNew->ptwiWaitInfo->lObjCount\n"
                   );
            lVar17 = *(long *)((long)pvVar11 + 0x38);
          }
          *(undefined4 *)(lVar17 + 4) = uVar15;
          iVar16 = iVar16 + 1;
          lVar17 = *plVar2;
        } while (lVar17 != 0);
      }
      pvLocalSynchData = local_60;
      pthrCurrent = local_68;
      uVar14 = local_40;
      if (local_38->m_ulcWaitingThreads != (ULONG)local_40) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xe0e);
        uVar14 = local_40;
        fprintf(_stderr,"Expression: psdShared->GetWaitingThreadCount() == ulcWaitingThreads\n");
      }
    }
    pCVar8 = local_38;
    pCVar1 = local_70;
    if (local_70->m_eOwnershipSemantics == OwnershipTracked) {
      pOVar5 = ((CSynchData *)pvLocalSynchData)->m_poolnOwnedObjectListNode;
      if (pOVar5 == (OwnedObjectsListNode *)0x0) {
        if (((CSynchData *)pvLocalSynchData)->m_lOwnershipCount != 0) {
          fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                  ,0xe2c);
          uVar14 = local_40;
          fprintf(_stderr,"Expression: 0 == psdLocal->GetOwnershipCount()\n");
        }
        if (local_38->m_lOwnershipCount != 0) {
          fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                  ,0xe2d);
          uVar14 = local_40;
          fprintf(_stderr,"Expression: 0 == psdShared->GetOwnershipCount()\n");
        }
        local_38->m_fAbandoned = ((CSynchData *)pvLocalSynchData)->m_fAbandoned;
      }
      else {
        pOVar5->pPalObjSynchData = local_38;
        local_38->m_poolnOwnedObjectListNode = pOVar5;
        LOCK();
        local_38->m_lRefCount = local_38->m_lRefCount + 1;
        UNLOCK();
        CSynchData::SetOwner(local_38,((CSynchData *)pvLocalSynchData)->m_pOwnerThread);
        pCVar8->m_lOwnershipCount = ((CSynchData *)pvLocalSynchData)->m_lOwnershipCount;
        uVar14 = local_40;
        if (pCVar8->m_fAbandoned == true) {
          fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                  ,0xe28);
          uVar14 = local_40;
          fprintf(_stderr,"Expression: !psdShared->IsAbandoned()\n");
        }
      }
    }
    if (pCVar1->m_eTypeId == otiProcess) {
      for (pMVar3 = local_50->m_pmplnMonitoredProcesses; pMVar3 != (MonitoredProcessesListNode *)0x0
          ; pMVar3 = pMVar3->pNext) {
        if (pMVar3->psdSynchData == (CSynchData *)pvLocalSynchData) {
          pMVar3->psdSynchData = local_38;
          LOCK();
          local_38->m_lRefCount = local_38->m_lRefCount + 1;
          UNLOCK();
        }
      }
      for (pMVar3 = local_50->m_pmplnExitedNodes; pMVar3 != (MonitoredProcessesListNode *)0x0;
          pMVar3 = pMVar3->pNext) {
        if (pMVar3->psdSynchData == (CSynchData *)pvLocalSynchData) {
          pMVar3->psdSynchData = local_38;
          LOCK();
          local_38->m_lRefCount = local_38->m_lRefCount + 1;
          UNLOCK();
        }
      }
      InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
    }
    pCVar6 = local_50;
    *(SHMPTR *)shridObj = local_58;
    if ((uVar14 != 0) &&
       ((((CSynchData *)pvLocalSynchData)->m_ptrWTLHead).ptr != (_WaitingThreadsListNode *)0x0)) {
      this_01 = &local_50->m_cacheWTListNodes;
      pobj = (((CSynchData *)pvLocalSynchData)->m_ptrWTLHead).ptr;
      do {
        p_Var4 = (pobj->ptrNext).ptr;
        CSynchCache<CorUnix::_WaitingThreadsListNode>::Add(this_01,pthrCurrent,pobj);
        pobj = p_Var4;
      } while (p_Var4 != (_WaitingThreadsListNode *)0x0);
    }
    CSynchCache<CorUnix::CSynchData>::Add
              (&pCVar6->m_cacheSynchData,pthrCurrent,(CSynchData *)pvLocalSynchData);
    PVar13 = 0;
  }
  else {
    puVar10 = (ulong *)InternalMalloc(uVar14 * 8 + 8);
    if (puVar10 == (ulong *)0x0) {
      return 0xe;
    }
    *puVar10 = uVar14;
    memset(puVar10 + 1,0,uVar14 * 8);
    local_48 = puVar10 + 1;
    if (local_48 == (SHMPTR *)0x0) {
      return 0xe;
    }
    this_00 = &local_50->m_cacheSHRWTListNodes;
    uVar9 = CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Get(this_00,pthrCurrent,n,local_48);
    if (uVar9 == n) goto LAB_003479a2;
    if ((int)(uVar9 - 1) < 0) {
      PVar13 = 0xe;
      goto LAB_00347d09;
    }
    lVar17 = (ulong)(uVar9 - 1) + 1;
    do {
      CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add(this_00,pthrCurrent,puVar10[lVar17]);
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
    PVar13 = 0xe;
  }
  if (local_48 == (SHMPTR *)0x0) {
    return PVar13;
  }
LAB_00347d09:
  InternalFree(local_48 + -1);
  return PVar13;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::PromoteObjectSynchData(
        CPalThread *pthrCurrent,
        VOID *pvLocalSynchData,
        VOID **ppvSharedSynchData)
    {
        PAL_ERROR palError = NO_ERROR;
        CSynchData *psdLocal = reinterpret_cast<CSynchData *>(pvLocalSynchData);
        CSynchData *psdShared = NULL;
        SharedID shridSynchData = NULLSharedID;
        SharedID *rgshridWTLNodes = NULL;
        CObjectType *pot = NULL;
        ULONG ulcWaitingThreads;

        _ASSERTE(NULL != pthrCurrent);
        _ASSERTE(NULL != pvLocalSynchData);
        _ASSERTE(NULL != ppvSharedSynchData);
        _ASSERTE(ProcessLocalObject == psdLocal->GetObjectDomain());

#if _DEBUG

        //
        // TODO: Verify that the proper locks are held
        //
#endif

        //
        // Allocate shared memory CSynchData and map to local memory
        //

        shridSynchData = m_cacheSHRSynchData.Get(pthrCurrent);
        if (NULLSharedID == shridSynchData)
        {
            ERROR("Unable to allocate shared memory\n");
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto POSD_exit;
        }

        psdShared = SharedIDToTypePointer(CSynchData, shridSynchData);
        _ASSERTE(NULL != psdShared);

        //
        // Allocate shared memory WaitingThreadListNodes if there are
        // any threads currently waiting on this object
        //

        ulcWaitingThreads = psdLocal->GetWaitingThreadCount();
        if (0 < ulcWaitingThreads)
        {
            int i;

            rgshridWTLNodes = InternalNewArray<SharedID>(ulcWaitingThreads);
            if (NULL == rgshridWTLNodes)
            {
                palError = ERROR_OUTOFMEMORY;
                goto POSD_exit;
            }

            i = m_cacheSHRWTListNodes.Get(
                    pthrCurrent,
                    ulcWaitingThreads,
                    rgshridWTLNodes
                    );

            if (static_cast<ULONG>(i) != ulcWaitingThreads)
            {
                for (i -= 1; i >= 0; i -= 1)
                {
                    m_cacheSHRWTListNodes.Add(pthrCurrent, rgshridWTLNodes[i]);
                }

                palError = ERROR_OUTOFMEMORY;
                goto POSD_exit;
            }
        }

        //
        // If the synch data is for a process object we need to grab
        // the monitored process list lock here
        //

        pot = psdLocal->GetObjectType();
        _ASSERTE(NULL != pot);

        if (otiProcess == pot->GetId())
        {
            InternalEnterCriticalSection(pthrCurrent, &s_csMonitoredProcessesLock);
        }

        //
        // Copy pertinent CSynchData info to the shared memory version (and
        // initialize other members)
        //

        psdShared->SetSharedThis(shridSynchData);
        psdShared->SetObjectDomain(SharedObject);
        psdShared->SetObjectType(psdLocal->GetObjectType());
        psdShared->SetSignalCount(psdLocal->GetSignalCount());

#ifdef SYNCH_STATISTICS
        psdShared->SetStatContentionCount(psdLocal->GetStatContentionCount());
        psdShared->SetStatWaitCount(psdLocal->GetStatWaitCount());
#endif

        //
        // Rebuild the waiting thread list, and update the wait domain
        // for the waiting threads
        //

        psdShared->SetWTLHeadShrPtr(NULLSharedID);
        psdShared->SetWTLTailShrPtr(NULLSharedID);

        if (0 < ulcWaitingThreads)
        {
            WaitingThreadsListNode *pwtlnOld;
            WaitingThreadsListNode *pwtlnNew;
            int i = 0;

            for (pwtlnOld = psdLocal->GetWTLHeadPtr();
                 pwtlnOld != NULL;
                 pwtlnOld = pwtlnOld->ptrNext.ptr, i += 1)
            {
                pwtlnNew = SharedIDToTypePointer(
                    WaitingThreadsListNode,
                    rgshridWTLNodes[i]
                    );

                _ASSERTE(NULL != pwtlnNew);

                pwtlnNew->shridSHRThis = rgshridWTLNodes[i];
                pwtlnNew->ptrOwnerObjSynchData.shrid = shridSynchData;

                pwtlnNew->dwThreadId = pwtlnOld->dwThreadId;
                pwtlnNew->dwProcessId = pwtlnOld->dwProcessId;
                pwtlnNew->dwObjIndex = pwtlnOld->dwObjIndex;
                pwtlnNew->dwFlags = pwtlnOld->dwFlags | WTLN_FLAG_OWNER_OBJECT_IS_SHARED;
                pwtlnNew->shridWaitingState = pwtlnOld->shridWaitingState;
                pwtlnNew->ptwiWaitInfo = pwtlnOld->ptwiWaitInfo;

                psdShared->SharedWaiterEnqueue(rgshridWTLNodes[i]);
                psdShared->AddRef();

                _ASSERTE(pwtlnOld = pwtlnOld->ptwiWaitInfo->rgpWTLNodes[pwtlnOld->dwObjIndex]);
                pwtlnNew->ptwiWaitInfo->rgpWTLNodes[pwtlnNew->dwObjIndex] = pwtlnNew;

                pwtlnNew->ptwiWaitInfo->lSharedObjCount += 1;
                if (pwtlnNew->ptwiWaitInfo->lSharedObjCount
                    == pwtlnNew->ptwiWaitInfo->lObjCount)
                {
                    pwtlnNew->ptwiWaitInfo->wdWaitDomain = SharedWait;
                }
                else
                {
                    _ASSERTE(pwtlnNew->ptwiWaitInfo->lSharedObjCount
                        < pwtlnNew->ptwiWaitInfo->lObjCount);

                    pwtlnNew->ptwiWaitInfo->wdWaitDomain = MixedWait;
                }
            }

            _ASSERTE(psdShared->GetWaitingThreadCount() == ulcWaitingThreads);
        }

        //
        // If the object tracks ownership and has a current owner update
        // the OwnedObjectsListNode to point to the shared memory synch
        // data
        //

        if (CObjectType::OwnershipTracked == pot->GetOwnershipSemantics())
        {
            OwnedObjectsListNode *pooln;

            pooln = psdLocal->GetOwnershipListNode();
            if (NULL != pooln)
            {
                pooln->pPalObjSynchData = psdShared;
                psdShared->SetOwnershipListNode(pooln);
                psdShared->AddRef();

                //
                // Copy over other ownership info.
                //

                psdShared->SetOwner(psdLocal->GetOwnerThread());
                psdShared->SetOwnershipCount(psdLocal->GetOwnershipCount());
                _ASSERTE(!psdShared->IsAbandoned());
            }
            else
            {
                _ASSERTE(0 == psdLocal->GetOwnershipCount());
                _ASSERTE(0 == psdShared->GetOwnershipCount());
                psdShared->SetAbandoned(psdLocal->IsAbandoned());
            }
        }

        //
        // If the synch data is for a process object update the monitored
        // process list nodes to point to the shared memory object data,
        // and release the monitored process list lock
        //

        if (otiProcess == pot->GetId())
        {
            MonitoredProcessesListNode *pmpn;

            pmpn = m_pmplnMonitoredProcesses;
            while (NULL != pmpn)
            {
                if (psdLocal == pmpn->psdSynchData)
                {
                    pmpn->psdSynchData = psdShared;
                    psdShared->AddRef();
                }

                pmpn = pmpn->pNext;
            }

            pmpn = m_pmplnExitedNodes;
            while (NULL != pmpn)
            {
                if (psdLocal == pmpn->psdSynchData)
                {
                    pmpn->psdSynchData = psdShared;
                    psdShared->AddRef();
                }

                pmpn = pmpn->pNext;
            }

            InternalLeaveCriticalSection(pthrCurrent, &s_csMonitoredProcessesLock);
        }

        *ppvSharedSynchData = reinterpret_cast<VOID*>(shridSynchData);

        //
        // Free the local memory items to caches
        //

        if (0 < ulcWaitingThreads)
        {
            WaitingThreadsListNode *pwtln;

            pwtln = psdLocal->GetWTLHeadPtr();
            while (NULL != pwtln)
            {
                WaitingThreadsListNode *pwtlnTemp;

                pwtlnTemp = pwtln;
                pwtln = pwtln->ptrNext.ptr;
                m_cacheWTListNodes.Add(pthrCurrent, pwtlnTemp);
            }
        }

        m_cacheSynchData.Add(pthrCurrent, psdLocal);

    POSD_exit:

        if (NULL != rgshridWTLNodes)
        {
            InternalDeleteArray(rgshridWTLNodes);
        }

        return palError;
    }